

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.h
# Opt level: O0

void quicly_maxsender_record(quicly_maxsender_t *m,int64_t value,quicly_maxsender_sent_t *sent)

{
  ulong *in_RDX;
  long in_RSI;
  long *in_RDI;
  
  if (*in_RDI <= in_RSI) {
    *in_RDI = in_RSI;
    in_RDI[2] = in_RDI[2] + 1;
    *(byte *)(in_RDI + 3) = *(byte *)(in_RDI + 3) & 0xfe;
    *in_RDX = *in_RDX & 0xfffffffffffffffe | 1;
    *in_RDX = *in_RDX & 1 | in_RSI << 1;
    return;
  }
  __assert_fail("value >= m->max_committed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                ,0x69,
                "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
               );
}

Assistant:

inline void quicly_maxsender_record(quicly_maxsender_t *m, int64_t value, quicly_maxsender_sent_t *sent)
{
    assert(value >= m->max_committed);
    m->max_committed = value;
    ++m->num_inflight;
    m->force_send = 0;
    sent->inflight = 1;
    sent->value = value;
}